

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

int __thiscall
embree::TutorialBenchmark::main(TutorialBenchmark *this,int argc,char **argv,string *name)

{
  string *str;
  char **argv_00;
  bool bVar1;
  string benchmark_name;
  CommandLine commandLine;
  allocator local_79;
  string local_78;
  CommandLine local_58 [4];
  CommandLine local_38;
  int local_2c;
  
  local_2c = argc;
  CommandLineParser::parseCommandLine(&this->commandLineParser,argc,argv);
  updateCommandLine(this,&local_2c,argv);
  CommandLine::CommandLine(&local_38,local_2c,argv);
  argv_00 = ((local_38.cl)->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  CommandLine::CommandLine
            (local_58,(int)((ulong)((long)((local_38.cl)->
                                          super__Vector_base<char_*,_std::allocator<char_*>_>).
                                          _M_impl.super__Vector_impl_data._M_finish - (long)argv_00)
                           >> 3),argv_00);
  local_38.cl = local_58[0].cl;
  (**this->_vptr_TutorialBenchmark)(this);
  std::__cxx11::string::string((string *)local_58,(string *)name);
  std::__cxx11::string::string((string *)&local_78,".xml",&local_79);
  str = &this->inputFile;
  bVar1 = endsWith(str,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar1) {
    getFileName(&local_78,str);
  }
  else {
    std::__cxx11::string::string((string *)&local_78,".ecs",&local_79);
    bVar1 = endsWith(str,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (!bVar1) goto LAB_0021abb2;
    getFileName(&local_78,str);
  }
  std::__cxx11::string::operator=((string *)local_58,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
LAB_0021abb2:
  bVar1 = std::operator!=(&(this->params).name,"");
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)local_58);
  }
  (*this->_vptr_TutorialBenchmark[1])
            (this,local_58,
             (ulong)((long)((local_38.cl)->super__Vector_base<char_*,_std::allocator<char_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)((local_38.cl)->super__Vector_base<char_*,_std::allocator<char_*>_>).
                          _M_impl.super__Vector_impl_data._M_start) >> 3);
  std::__cxx11::string::~string((string *)local_58);
  return 0;
}

Assistant:

int TutorialBenchmark::main(int argc, char** argv, std::string name)
{
  commandLineParser.parseCommandLine(argc, argv);
  updateCommandLine(argc, argv);

  CommandLine commandLine(argc, argv);

#if USE_GOOGLE_BENCHMARK
  if (!params.legacy && params.minTimeOrIterations > 0)
    commandLine.add({"--benchmark_min_time=" + std::to_string(params.minTimeOrIterations)});
  if (!params.legacy && params.repetitions > 0)
    commandLine.add({"--benchmark_repetitions=" + std::to_string(params.repetitions)});
#endif

  argc = commandLine.argc();
  argv = commandLine.argv();

#ifdef USE_GOOGLE_BENCHMARK
  if (!params.legacy)
    ::benchmark::Initialize(&argc, argv);
#endif

  commandLine = CommandLine(argc, argv);

  postParseCommandLine();

  std::string benchmark_name = name;
  if (endsWith(inputFile, ".xml")) {
    benchmark_name = getFileName(inputFile);
  }
  else if (endsWith(inputFile, ".ecs")) {
    benchmark_name = getFileName(inputFile);
  }

  if (params.name != "")
    benchmark_name = params.name;

  registerBenchmark(benchmark_name, commandLine.argc(), commandLine.argv());

#ifdef USE_GOOGLE_BENCHMARK
  if (!params.legacy)
    ::benchmark::RunSpecifiedBenchmarks();
#endif

  return 0;
}